

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O3

void __thiscall mesh<double>::mesh(mesh<double> *this,string *file,shared_ptr<material<double>_> *m)

{
  vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_> *this_00;
  pointer *ppvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  iterator __position;
  pointer pvVar3;
  char cVar4;
  istream *piVar5;
  long lVar6;
  pointer pbVar7;
  long lVar8;
  pointer pbVar9;
  int *piVar10;
  undefined8 uVar11;
  pointer pbVar12;
  pointer pbVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  vec3<double> local_4f8;
  undefined1 local_4d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  pointer local_4c0;
  string line;
  string op;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  double local_448;
  double dStack_440;
  double local_438;
  undefined8 uStack_430;
  undefined1 local_428 [16];
  value_type local_418;
  shared_ptr<material<double>_> *local_400;
  pointer local_3f8;
  pointer local_3e8;
  pointer local_3d8;
  stringstream lstream;
  ostream local_3b0 [112];
  ios_base local_340 [264];
  ifstream file_;
  
  (this->super_hit<double>)._vptr_hit = (_func_int **)&PTR_is_hit_0010ecf0;
  (this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (m->super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (m->super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_400 = m;
  std::ifstream::ifstream(&this->file_);
  (this->max_).e[1] = 0.0;
  (this->max_).e[2] = 0.0;
  (this->min_).e[2] = 0.0;
  (this->max_).e[0] = 0.0;
  (this->min_).e[0] = 0.0;
  (this->min_).e[1] = 0.0;
  (this->faces).super_hit<double>._vptr_hit = (_func_int **)&PTR_is_hit_0010e8f0;
  this_00 = &(this->faces).obj_list;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file_,(string *)file,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&lstream);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428._8_8_ = 0x4024000000000000;
  local_428._0_8_ = 0x4024000000000000;
  local_438 = 0.0;
  uStack_430 = 0;
  local_4c0 = (pointer)0x4024000000000000;
  local_448 = 0.0;
  dStack_440 = 0.0;
  pbVar9 = local_4c0;
LAB_00107e43:
  do {
    while( true ) {
      local_4c0 = pbVar9;
      cVar4 = std::ios::widen((char)*(undefined8 *)(_file_ + -0x18) + (char)(istream *)&file_);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file_,(string *)&line,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        (this->min_).e[0] = (double)local_428._0_8_;
        (this->min_).e[1] = (double)local_428._8_8_;
        (this->min_).e[2] = (double)local_4c0;
        (this->max_).e[0] = local_448;
        (this->max_).e[1] = dStack_440;
        (this->max_).e[2] = local_438;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&lstream);
        std::ios_base::~ios_base(local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op._M_dataplus._M_p != &op.field_2) {
          operator_delete(op._M_dataplus._M_p,
                          CONCAT71(op.field_2._M_allocated_capacity._1_7_,op.field_2._M_local_buf[0]
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p,
                          CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                   line.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(&file_);
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_3b0,line._M_dataplus._M_p,line._M_string_length);
      std::operator>>((istream *)&lstream,(string *)&op);
      split<double>(&local_468,&line,' ');
      local_4f8.e[2] =
           (double)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_4f8.e[1] =
           (double)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_4f8.e[0] =
           (double)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if (*line._M_dataplus._M_p != 'f') break;
      pbVar9 = (pointer)local_4d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar10 = __errno_location();
      iVar15 = *piVar10;
      *piVar10 = 0;
      lVar6 = strtol((char *)pbVar9,(char **)&local_4f8,10);
      if ((pointer)local_4f8.e[0] == pbVar9) {
LAB_0010848d:
        std::__throw_invalid_argument("stoi");
        pbVar7 = pbVar9;
LAB_00108499:
        std::__throw_out_of_range("stoi");
LAB_001084a5:
        std::__throw_out_of_range("stoi");
        pbVar9 = pbVar7;
LAB_001084b4:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pbVar9);
LAB_001084c5:
        std::__throw_invalid_argument("stod");
        goto LAB_001084d1;
      }
      pbVar7 = pbVar9;
      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (iVar14 = *piVar10, iVar14 == 0x22))
      goto LAB_00108499;
      if (iVar14 == 0) {
        *piVar10 = iVar15;
        iVar14 = iVar15;
      }
      pbVar12 = (pointer)local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      *piVar10 = 0;
      pbVar7 = (pointer)strtol((char *)pbVar12,(char **)&local_4f8,10);
      if ((pointer)local_4f8.e[0] == pbVar12) {
        std::__throw_invalid_argument("stoi");
LAB_00108481:
        std::__throw_out_of_range("stoi");
        goto LAB_0010848d;
      }
      pbVar9 = pbVar7;
      if ((pbVar7 + -0x4000000 < (pointer)0xffffffff00000000) || (iVar15 = *piVar10, iVar15 == 0x22)
         ) goto LAB_00108481;
      if (iVar15 == 0) {
        *piVar10 = iVar14;
        iVar15 = iVar14;
      }
      pbVar9 = (pointer)local_4d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      *piVar10 = 0;
      lVar8 = strtol((char *)pbVar9,(char **)&local_4f8,10);
      if ((pointer)local_4f8.e[0] == pbVar9) {
        pbVar9 = (pointer)std::__throw_invalid_argument("stoi");
        goto LAB_001084b4;
      }
      if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_001084a5;
      if (*piVar10 == 0) {
        *piVar10 = iVar15;
      }
      pbVar13 = (pointer)((lVar6 << 0x20) + -0x100000000 >> 0x20);
      pvVar3 = (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pbVar12 = (pointer)(((long)(this->verts).
                                 super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                         -0x5555555555555555);
      pbVar9 = pbVar13;
      if (((pbVar12 < pbVar13 || (long)pbVar12 - (long)pbVar13 == 0) ||
          (pbVar7 = (pointer)(((long)pbVar7 << 0x20) + -0x100000000 >> 0x20), pbVar9 = pbVar7,
          pbVar12 < pbVar7 || (long)pbVar12 - (long)pbVar7 == 0)) ||
         (pbVar9 = (pointer)((lVar8 << 0x20) + -0x100000000 >> 0x20),
         pbVar12 < pbVar9 || (long)pbVar12 - (long)pbVar9 == 0)) goto LAB_001084b4;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_468.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_4f8.e[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<triangle<double>,std::allocator<triangle<double>>,vec3<double>&,vec3<double>&,vec3<double>&,int,std::shared_ptr<material<double>>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4f8.e + 1),
                 (triangle<double> **)&local_4f8,(allocator<triangle<double>_> *)&local_4d9,
                 pvVar3 + (long)pbVar13,pvVar3 + (long)pbVar7,pvVar3 + (long)pbVar9,
                 (int *)&local_468,local_400);
      local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4f8.e[0];
      local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8.e[1];
      local_4f8.e[0] = 0.0;
      local_4f8.e[1] = 0.0;
      std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
      push_back(this_00,&local_418);
      if ((pointer)local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      pbVar9 = local_4c0;
      if ((pointer)local_4f8.e[1] != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8.e[1]);
        pbVar9 = local_4c0;
      }
    }
    pbVar9 = local_4c0;
  } while (*line._M_dataplus._M_p != 'v');
  pbVar9 = (pointer)local_4d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  piVar10 = __errno_location();
  iVar15 = *piVar10;
  *piVar10 = 0;
  local_3d8 = (pointer)strtod((char *)pbVar9,(char **)&local_4f8);
  if ((pointer)local_4f8.e[0] == pbVar9) {
LAB_001084d1:
    std::__throw_invalid_argument("stod");
LAB_001084dd:
    std::__throw_invalid_argument("stod");
LAB_001084e9:
    std::__throw_out_of_range("stod");
  }
  else {
    iVar14 = *piVar10;
    if (iVar14 != 0) {
      iVar15 = iVar14;
      if (iVar14 != 0x22) goto LAB_001081f1;
      goto LAB_001084e9;
    }
    *piVar10 = iVar15;
LAB_001081f1:
    pbVar9 = (pointer)local_4d8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    *piVar10 = 0;
    local_3e8 = (pointer)strtod((char *)pbVar9,(char **)&local_4f8);
    if ((pointer)local_4f8.e[0] == pbVar9) goto LAB_001084dd;
    iVar14 = *piVar10;
    if (iVar14 == 0) {
      *piVar10 = iVar15;
LAB_0010823e:
      pbVar9 = (pointer)local_4d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      *piVar10 = 0;
      local_3f8 = (pointer)strtod((char *)pbVar9,(char **)&local_4f8);
      if ((pointer)local_4f8.e[0] == pbVar9) goto LAB_001084c5;
      if (*piVar10 == 0) {
        *piVar10 = iVar15;
      }
      else if (*piVar10 == 0x22) goto LAB_00108501;
      local_4f8.e[0] = (double)local_3d8;
      local_4f8.e[1] = (double)local_3e8;
      __position._M_current =
           (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_4f8.e[2] = (double)local_3f8;
      if (__position._M_current ==
          (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<vec3<double>,std::allocator<vec3<double>>>::_M_realloc_insert<vec3<double>>
                  ((vector<vec3<double>,std::allocator<vec3<double>>> *)&this->verts,__position,
                   &local_4f8);
      }
      else {
        (__position._M_current)->e[2] = (double)local_3f8;
        (__position._M_current)->e[0] = (double)local_3d8;
        (__position._M_current)->e[1] = (double)local_3e8;
        ppvVar1 = &(this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      auVar18._8_8_ = local_3e8;
      auVar18._0_8_ = local_3d8;
      uVar16 = -(ulong)(local_428._0_8_ < (double)local_3d8);
      uVar17 = -(ulong)(local_428._8_8_ < (double)local_3e8);
      local_448 = (double)(~uVar16 & (ulong)local_448 | (ulong)local_3d8 & uVar16);
      dStack_440 = (double)(~uVar17 & (ulong)dStack_440 | (ulong)local_3e8 & uVar17);
      local_438 = (double)(~-(ulong)((double)local_4c0 < (double)local_3f8) & (ulong)local_438 |
                          -(ulong)((double)local_4c0 < (double)local_3f8) & (ulong)local_3f8);
      local_428 = minpd(auVar18,local_428);
      pbVar9 = local_3f8;
      if ((double)local_4c0 <= (double)local_3f8) {
        pbVar9 = local_4c0;
      }
      goto LAB_00107e43;
    }
    iVar15 = iVar14;
    if (iVar14 != 0x22) goto LAB_0010823e;
  }
  std::__throw_out_of_range("stod");
LAB_00108501:
  uVar11 = std::__throw_out_of_range("stod");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&lstream);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p,
                    CONCAT71(op.field_2._M_allocated_capacity._1_7_,op.field_2._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line._M_dataplus._M_p != &line.field_2) {
    operator_delete(line._M_dataplus._M_p,
                    CONCAT71(line.field_2._M_allocated_capacity._1_7_,line.field_2._M_local_buf[0])
                    + 1);
  }
  std::ifstream::~ifstream(&file_);
  pvVar3 = (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar3 != (pointer)0x0) {
    operator_delete(pvVar3,(long)(this->verts).
                                 super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  (this->faces).super_hit<double>._vptr_hit = (_func_int **)&PTR_is_hit_0010e8f0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  ~vector(this_00);
  std::ifstream::~ifstream(&this->file_);
  p_Var2 = (this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

mesh<T>::mesh(const std::string& file, std::shared_ptr<material<T>> m) : m_(m) {
  std::ifstream file_(file);
  std::string line, op;
  std::stringstream lstream;
  std::vector<std::string> ss;

  vec3<T> temp_pos;
  T x, y, z;
  int count{0};
  int i = 0;
  T minx(10), miny(10), minz(10);
  T maxx(0), maxy(0), maxz(0);
  while (std::getline(file_, line)) {
    lstream << line;
    lstream >> op;
    ss = split<T>(line, ' ');
    // std::cerr << ss[0] << "\n";
    if (line[0] == 'v') {
      // std::cerr << "PRINT \n";
      // lstream >> x >> y >> z;
      x = std::stod(ss[1]);
      y = std::stod(ss[2]);
      z = std::stod(ss[3]);
      if (x > minx)
        maxx = x;
      if (y > miny)
        maxy = y;
      if (z > minz)
        maxz = z;
      if (x < minx)
        minx = x;
      if (y < miny)
        miny = y;
      if (z < minz)
        minz = z;

      point3<T> temp_vert(x, y, z);
      verts.push_back(1.0 * temp_vert);
    } else if (line[0] == 'f') {
      int v0, v1, v2;
      v0 = std::stoi(ss[1]);
      v1 = std::stoi(ss[2]);
      v2 = std::stoi(ss[3]);
      // lstream >> v0 >> v1 >> v2;
      faces.add(std::make_shared<triangle<T>>(
          verts.at(v0 - 1), verts.at(v1 - 1), verts.at(v2 - 1), 0, m));
    }
  }
  min_ = point3<T>(minx, miny, minz);
  max_ = point3<T>(maxx, maxy, maxz);
}